

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O1

string * __thiscall
Type::EvalByteOrder_abi_cxx11_(string *__return_storage_ptr__,Type *this,Output *out_cc,Env *env)

{
  Expr *this_00;
  char *__s;
  Env *env_00;
  allocator<char> *__a;
  allocator<char> local_22;
  allocator<char> local_21;
  
  this_00 = this->attr_byteorder_expr_;
  if ((this_00 == (Expr *)0x0) || (this->declared_as_type_ != false)) {
    Env::Evaluate(env,out_cc,byteorder_id);
    __s = Env::RValue(env,byteorder_id);
    __a = &local_22;
  }
  else {
    env_00 = global_env();
    __s = Expr::EvalExpr(this_00,out_cc,env_00);
    __a = &local_21;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

string Type::EvalByteOrder(Output* out_cc, Env* env) const
	{
	// If &byteorder is specified for a field, rather
	// than a type declaration, we do not add a byteorder variable
	// to the class, but instead evaluate it directly.
	if ( attr_byteorder_expr() && ! declared_as_type() )
		return attr_byteorder_expr()->EvalExpr(out_cc, global_env());
	env->Evaluate(out_cc, byteorder_id);
	return env->RValue(byteorder_id);
	}